

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

handle pybind11::detail::
       list_caster<std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>,std::shared_ptr<kratos::Generator>>
       ::
       cast<std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>>
                 (vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer psVar1;
  handle hVar2;
  long lVar3;
  pointer existing_holder;
  PyObject *tmp;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar4;
  handle local_40;
  object value_;
  list l;
  
  list::list<unsigned_long,_0>
            ((list *)&value_,
             (long)(src->
                   super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(src->
                   super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  existing_holder =
       (src->
       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (src->
           super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (existing_holder != psVar1) {
    lVar3 = 0;
    do {
      pVar4 = type_caster_base<kratos::Generator>::src_and_type
                        ((itype *)(existing_holder->
                                  super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr);
      hVar2 = type_caster_generic::cast
                        (pVar4.first,take_ownership,(handle)0x0,pVar4.second,
                         (_func_void_ptr_void_ptr *)0x0,(_func_void_ptr_void_ptr *)0x0,
                         existing_holder);
      local_40 = hVar2;
      if (hVar2.m_ptr != (PyObject *)0x0) {
        local_40.m_ptr = (PyObject *)0x0;
        if ((*(byte *)(*(long *)((long)value_.super_handle.m_ptr + 8) + 0xab) & 2) == 0) {
          __assert_fail("PyList_Check(l.ptr())",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/stl.h"
                        ,0xa4,
                        "static handle pybind11::detail::list_caster<std::vector<std::shared_ptr<kratos::Generator>>, std::shared_ptr<kratos::Generator>>::cast(T &&, return_value_policy, handle) [Type = std::vector<std::shared_ptr<kratos::Generator>>, Value = std::shared_ptr<kratos::Generator>, T = std::vector<std::shared_ptr<kratos::Generator>>]"
                       );
        }
        *(PyObject **)(*(long *)((long)value_.super_handle.m_ptr + 0x18) + lVar3 * 8) = hVar2.m_ptr;
        lVar3 = lVar3 + 1;
      }
      object::~object((object *)&local_40);
      if (hVar2.m_ptr == (PyObject *)0x0) {
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_002b2e61;
      }
      existing_holder = existing_holder + 1;
    } while (existing_holder != psVar1);
  }
  hVar2 = value_.super_handle.m_ptr;
  value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_002b2e61:
  object::~object(&value_);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        ssize_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }